

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall helics::FilterFederate::processFilterReturn(FilterFederate *this,ActionMessage *cmd)

{
  atomic<int> *paVar1;
  uint32_t pid;
  uint32_t pid_00;
  GlobalFederateId fid;
  pointer ppFVar2;
  FilterInfo *filt;
  InterfaceHandle IVar3;
  BasicHandleInfo *pBVar4;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  iterator iVar5;
  mapped_type *pmVar6;
  FilterCoordinator *pFVar7;
  ulong uVar8;
  pair<helics::ActionMessage_&,_bool> pVar9;
  uint32_t local_38;
  BaseType fid_index;
  
  pBVar4 = HandleManager::getInterfaceHandle
                     (this->mHandles,(InterfaceHandle)(cmd->dest_handle).hid,ENDPOINT);
  if (pBVar4 != (BasicHandleInfo *)0x0) {
    pid_00 = cmd->sequenceID;
    fid.gid = (pBVar4->handle).fed_id.gid;
    fid_index = fid.gid;
    this_00 = &std::
               map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](&this->ongoingFilterProcesses,&fid_index)->_M_t;
    local_38 = pid_00;
    iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (this_00,(key_type *)&local_38);
    pmVar6 = std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingFilterProcesses,&fid_index);
    if ((_Rb_tree_header *)iVar5._M_node != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header) {
      if (cmd->messageAction != cmd_null_message) {
        pFVar7 = getFilterCoordinator(this,(InterfaceHandle)(pBVar4->handle).handle.hid);
        ActionMessage::setAction(cmd,cmd_send_message);
        uVar8 = (ulong)cmd->counter;
        do {
          uVar8 = uVar8 + 1;
          ppFVar2 = (pFVar7->sourceFilters).
                    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pFVar7->sourceFilters).
                            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3) <=
              uVar8) goto LAB_002ecf01;
          filt = ppFVar2[uVar8];
        } while (((filt->flags & 0x1000) != 0) ||
                (pVar9 = executeFilter(this,cmd,filt),
                ((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0));
        if (cmd->messageAction != cmd_ignore) {
          if (uVar8 < ((long)(pFVar7->sourceFilters).
                             super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pFVar7->sourceFilters).
                             super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
            cmd->counter = (uint16_t)uVar8;
            ActionMessage::setAction(cmd,cmd_send_for_filter_return);
            LOCK();
            paVar1 = &this->messageCounter;
            pid = (paVar1->super___atomic_base<int>)._M_i;
            (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
            UNLOCK();
            cmd->sequenceID = pid;
            IVar3.hid = (pBVar4->handle).handle.hid;
            cmd->source_id = (GlobalFederateId)(pBVar4->handle).fed_id.gid;
            cmd->source_handle = (InterfaceHandle)IVar3.hid;
            generateProcessMarker
                      (this,(GlobalFederateId)(pBVar4->handle).fed_id.gid,pid,
                       (Time)(cmd->actionTime).internalTimeCode);
          }
          else {
            ActionMessage::setAction(cmd,cmd_send_for_filter);
          }
LAB_002ecf01:
          acceptProcessReturn(this,fid,pid_00);
          std::function<void_(helics::ActionMessage_&)>::operator()(&this->mDeliverMessage,cmd);
          return;
        }
      }
      acceptProcessReturn(this,fid,pid_00);
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterReturn(ActionMessage& cmd)
{
    auto* handle = mHandles->getInterfaceHandle(cmd.dest_handle, InterfaceType::ENDPOINT);
    if (handle == nullptr) {
        return;
    }

    auto mid = cmd.sequenceID;
    auto fid = handle->getFederateId();
    auto fid_index = fid.baseValue();

    if (ongoingFilterProcesses[fid_index].find(mid) != ongoingFilterProcesses[fid_index].end()) {
        if (cmd.action() == CMD_NULL_MESSAGE) {
            acceptProcessReturn(fid, mid);
            return;
        }
        auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());
        cmd.setAction(CMD_SEND_MESSAGE);
        bool needToSendMessage{true};
        for (auto ii = static_cast<size_t>(cmd.counter) + 1; ii < filtFunc->sourceFilters.size();
             ++ii) {
            auto* filt = filtFunc->sourceFilters[ii];
            if (checkActionFlag(*filt, disconnected_flag)) {
                continue;
            }

            auto press = executeFilter(cmd, filt);
            if (!press.second) {
                if (cmd.action() == CMD_IGNORE) {
                    needToSendMessage = false;
                    break;
                }

                if (ii < filtFunc->sourceFilters.size() - 1) {
                    cmd.counter = static_cast<uint16_t>(ii);
                    cmd.setAction(CMD_SEND_FOR_FILTER_AND_RETURN);
                    cmd.sequenceID = messageCounter++;
                    cmd.setSource(handle->handle);
                    generateProcessMarker(handle->getFederateId(), cmd.sequenceID, cmd.actionTime);
                } else {
                    cmd.setAction(CMD_SEND_FOR_FILTER);
                }
                break;
            }
        }
        acceptProcessReturn(fid, mid);
        if (needToSendMessage) {
            mDeliverMessage(cmd);
        }
    }
}